

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O1

Error __thiscall asmjit::v1_14::CodeHolder::flatten(CodeHolder *this)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  Error EVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  
  lVar1 = *(long *)&this->_sectionsByOrder;
  uVar6 = (ulong)*(uint *)&this->field_0xf0;
  bVar11 = uVar6 == 0;
  if (!bVar11) {
    lVar7 = 0;
    uVar10 = 0;
    do {
      lVar5 = *(long *)(lVar1 + lVar7);
      uVar8 = *(ulong *)(lVar5 + 0x50);
      if (*(ulong *)(lVar5 + 0x50) < *(ulong *)(lVar5 + 0x18)) {
        uVar8 = *(ulong *)(lVar5 + 0x18);
      }
      if (uVar8 == 0) {
        bVar3 = true;
      }
      else {
        uVar9 = -(ulong)*(uint *)(lVar5 + 8) & (uVar10 + *(uint *)(lVar5 + 8)) - 1;
        if (uVar9 < uVar10) {
          bVar3 = false;
        }
        else {
          uVar10 = uVar9 + uVar8;
          bVar3 = !CARRY8(uVar9,uVar8);
        }
      }
      if (!bVar3) break;
      lVar7 = lVar7 + 8;
      bVar11 = uVar6 * 8 - lVar7 == 0;
    } while (!bVar11);
  }
  EVar4 = 9;
  if (bVar11) {
    if (uVar6 != 0) {
      lVar5 = 0;
      uVar10 = 0;
      lVar7 = 0;
      do {
        lVar2 = *(long *)(lVar1 + lVar5);
        uVar8 = *(ulong *)(lVar2 + 0x50);
        if (*(ulong *)(lVar2 + 0x50) < *(ulong *)(lVar2 + 0x18)) {
          uVar8 = *(ulong *)(lVar2 + 0x18);
        }
        if (uVar8 != 0) {
          uVar10 = -(ulong)*(uint *)(lVar2 + 8) & (uVar10 + *(uint *)(lVar2 + 8)) - 1;
        }
        *(ulong *)(lVar2 + 0x10) = uVar10;
        if (lVar7 != 0) {
          *(ulong *)(lVar7 + 0x18) = uVar10 - *(long *)(lVar7 + 0x10);
        }
        uVar10 = uVar10 + uVar8;
        lVar5 = lVar5 + 8;
        lVar7 = lVar2;
      } while (uVar6 << 3 != lVar5);
    }
    EVar4 = 0;
  }
  return EVar4;
}

Assistant:

Error CodeHolder::flatten() noexcept {
  uint64_t offset = 0;
  for (Section* section : _sectionsByOrder) {
    uint64_t realSize = section->realSize();
    if (realSize) {
      uint64_t alignedOffset = Support::alignUp(offset, section->alignment());
      if (ASMJIT_UNLIKELY(alignedOffset < offset))
        return DebugUtils::errored(kErrorTooLarge);

      Support::FastUInt8 of = 0;
      offset = Support::addOverflow(alignedOffset, realSize, &of);

      if (ASMJIT_UNLIKELY(of))
        return DebugUtils::errored(kErrorTooLarge);
    }
  }

  // Now we know that we can assign offsets of all sections properly.
  Section* prev = nullptr;
  offset = 0;
  for (Section* section : _sectionsByOrder) {
    uint64_t realSize = section->realSize();
    if (realSize)
      offset = Support::alignUp(offset, section->alignment());
    section->_offset = offset;

    // Make sure the previous section extends a bit to cover the alignment.
    if (prev)
      prev->_virtualSize = offset - prev->_offset;

    prev = section;
    offset += realSize;
  }

  return kErrorOk;
}